

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  short sVar4;
  short sVar5;
  char cVar6;
  ulong uVar7;
  uint uVar8;
  uint16_t *puVar9;
  uint16_t *puVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint16_t *puVar16;
  uint uVar17;
  long lVar18;
  uint16_t *puVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [16];
  short sVar26;
  int iVar27;
  int iVar33;
  int iVar34;
  undefined1 in_XMM8 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar35;
  undefined1 auVar31 [16];
  short sVar36;
  undefined1 auVar32 [16];
  int iVar37;
  int iVar42;
  int iVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar44;
  undefined1 auVar41 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM11 [16];
  
  iVar12 = conv_params->round_0 + conv_params->round_1;
  cVar6 = (char)bd - (char)iVar12;
  uVar11 = 0xe - iVar12;
  puVar3 = conv_params->dst;
  auVar20 = ZEXT416(uVar11);
  uVar17 = (1 << (cVar6 + 0xdU & 0x1f)) + (1 << (cVar6 + 0xeU & 0x1f));
  uVar14 = 0xff;
  if (bd == 0xc) {
    uVar14 = 0xfff;
  }
  iVar12 = conv_params->dst_stride;
  uVar8 = 0x3ff;
  if (bd != 10) {
    uVar8 = uVar14;
  }
  lVar18 = (long)iVar12;
  iVar1 = conv_params->do_average;
  iVar24 = conv_params->fwd_offset;
  iVar27 = conv_params->bck_offset;
  iVar2 = conv_params->use_dist_wtd_comp_avg;
  auVar21._4_4_ = iVar24;
  auVar21._0_4_ = iVar24;
  auVar21._8_4_ = iVar24;
  auVar21._12_4_ = iVar24;
  auVar22._4_4_ = iVar27;
  auVar22._0_4_ = iVar27;
  auVar22._8_4_ = iVar27;
  auVar22._12_4_ = iVar27;
  auVar23 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0);
  auVar23._4_4_ = auVar23._0_4_;
  auVar23._8_4_ = auVar23._0_4_;
  auVar23._12_4_ = auVar23._0_4_;
  iVar24 = (1 << ((byte)uVar11 & 0x1f)) >> 1;
  auVar25 = pshuflw(ZEXT416(uVar8),ZEXT416(uVar8),0);
  sVar4 = auVar25._0_2_;
  sVar5 = auVar25._2_2_;
  if ((w & 7U) == 0) {
    if (0 < h) {
      lVar13 = 0;
      uVar7 = 0;
      puVar19 = puVar3;
      do {
        if (0 < w) {
          lVar15 = 0;
          do {
            auVar25 = psllw(*(undefined1 (*) [16])(src + lVar15),auVar20);
            if (iVar1 == 0) {
              in_XMM8 = paddusw(auVar25,auVar23);
              puVar10 = puVar3;
              iVar27 = iVar12;
            }
            else {
              auVar29 = *(undefined1 (*) [16])(puVar19 + lVar15);
              in_XMM11 = pmovzxwd(in_XMM11,auVar29);
              auVar45 = pmovzxwd(in_XMM8,auVar25);
              auVar32._0_4_ = auVar45._0_4_ + uVar17;
              auVar32._4_4_ = auVar45._4_4_ + uVar17;
              auVar32._8_4_ = auVar45._8_4_ + uVar17;
              auVar32._12_4_ = auVar45._12_4_ + uVar17;
              if (iVar2 == 0) {
                iVar27 = auVar32._0_4_ + in_XMM11._0_4_ >> 1;
                iVar33 = auVar32._4_4_ + in_XMM11._4_4_ >> 1;
                iVar34 = auVar32._8_4_ + in_XMM11._8_4_ >> 1;
                iVar35 = auVar32._12_4_ + in_XMM11._12_4_ >> 1;
              }
              else {
                in_XMM11 = pmulld(in_XMM11,auVar21);
                auVar45 = pmulld(auVar32,auVar22);
                iVar27 = auVar45._0_4_ + in_XMM11._0_4_ >> 4;
                iVar33 = auVar45._4_4_ + in_XMM11._4_4_ >> 4;
                iVar34 = auVar45._8_4_ + in_XMM11._8_4_ >> 4;
                iVar35 = auVar45._12_4_ + in_XMM11._12_4_ >> 4;
              }
              auVar46._0_4_ = CONCAT22(0,auVar29._8_2_);
              auVar46._4_2_ = auVar29._10_2_;
              auVar46._6_2_ = 0;
              auVar46._8_2_ = auVar29._12_2_;
              auVar46._10_2_ = 0;
              auVar46._12_2_ = auVar29._14_2_;
              auVar46._14_2_ = 0;
              auVar45._0_4_ = auVar25._8_2_ + uVar17;
              auVar45._4_4_ = auVar25._10_2_ + uVar17;
              auVar45._8_4_ = auVar25._12_2_ + uVar17;
              auVar45._12_4_ = auVar25._14_2_ + uVar17;
              if (iVar2 == 0) {
                iVar37 = (int)(auVar45._0_4_ + auVar46._0_4_) >> 1;
                iVar42 = (int)(auVar45._4_4_ + (uint)auVar29._10_2_) >> 1;
                iVar43 = (int)(auVar45._8_4_ + (uint)auVar29._12_2_) >> 1;
                iVar44 = (int)(auVar45._12_4_ + (uint)auVar29._14_2_) >> 1;
              }
              else {
                auVar29 = pmulld(auVar46,auVar21);
                auVar25 = pmulld(auVar45,auVar22);
                iVar37 = auVar25._0_4_ + auVar29._0_4_ >> 4;
                iVar42 = auVar25._4_4_ + auVar29._4_4_ >> 4;
                iVar43 = auVar25._8_4_ + auVar29._8_4_ >> 4;
                iVar44 = auVar25._12_4_ + auVar29._12_4_ >> 4;
              }
              auVar25._0_4_ = (int)(iVar27 + (iVar24 - uVar17)) >> auVar20;
              auVar25._4_4_ = (int)(iVar33 + (iVar24 - uVar17)) >> auVar20;
              auVar25._8_4_ = (int)(iVar34 + (iVar24 - uVar17)) >> auVar20;
              auVar25._12_4_ = (int)(iVar35 + (iVar24 - uVar17)) >> auVar20;
              auVar29._0_4_ = (int)(iVar37 + (iVar24 - uVar17)) >> auVar20;
              auVar29._4_4_ = (int)(iVar42 + (iVar24 - uVar17)) >> auVar20;
              auVar29._8_4_ = (int)(iVar43 + (iVar24 - uVar17)) >> auVar20;
              auVar29._12_4_ = (int)(iVar44 + (iVar24 - uVar17)) >> auVar20;
              auVar25 = packusdw(auVar25,auVar29);
              sVar26 = auVar25._0_2_;
              in_XMM8._0_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26;
              sVar26 = auVar25._2_2_;
              in_XMM8._2_2_ = (ushort)(sVar5 < sVar26) * sVar5 | (ushort)(sVar5 >= sVar26) * sVar26;
              sVar26 = auVar25._4_2_;
              in_XMM8._4_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26;
              sVar26 = auVar25._6_2_;
              in_XMM8._6_2_ = (ushort)(sVar5 < sVar26) * sVar5 | (ushort)(sVar5 >= sVar26) * sVar26;
              sVar26 = auVar25._8_2_;
              in_XMM8._8_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26;
              sVar26 = auVar25._10_2_;
              in_XMM8._10_2_ = (ushort)(sVar5 < sVar26) * sVar5 | (ushort)(sVar5 >= sVar26) * sVar26
              ;
              sVar26 = auVar25._12_2_;
              sVar36 = auVar25._14_2_;
              in_XMM8._12_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26
              ;
              in_XMM8._14_2_ = (ushort)(sVar5 < sVar36) * sVar5 | (ushort)(sVar5 >= sVar36) * sVar36
              ;
              puVar10 = dst0;
              iVar27 = dst_stride0;
            }
            *(undefined1 (*) [16])((long)puVar10 + lVar15 * 2 + iVar27 * lVar13) = in_XMM8;
            lVar15 = lVar15 + 8;
          } while (lVar15 < w);
        }
        uVar7 = uVar7 + 1;
        puVar19 = puVar19 + lVar18;
        src = src + src_stride;
        lVar13 = lVar13 + 2;
      } while (uVar7 != (uint)h);
    }
  }
  else if (0 < h && (w & 3U) == 0) {
    lVar13 = (long)src_stride;
    puVar19 = src + lVar13;
    puVar10 = puVar3 + lVar18;
    uVar7 = 0;
    puVar16 = puVar3;
    do {
      if (0 < w) {
        lVar15 = 0;
        do {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(puVar19 + lVar15);
          auVar38._8_8_ = *(ulong *)(puVar19 + lVar15);
          auVar38._0_8_ = *(undefined8 *)(src + lVar15);
          auVar25 = psllw(auVar38,auVar20);
          if (iVar1 == 0) {
            auVar39 = paddusw(auVar25,auVar23);
            puVar9 = puVar3;
            iVar27 = iVar12;
          }
          else {
            auVar45 = pmovzxwd(in_XMM10,*(undefined8 *)(puVar16 + lVar15));
            auVar29 = pmovzxwd(auVar28,auVar25);
            auVar30._0_4_ = auVar29._0_4_ + uVar17;
            auVar30._4_4_ = auVar29._4_4_ + uVar17;
            auVar30._8_4_ = auVar29._8_4_ + uVar17;
            auVar30._12_4_ = auVar29._12_4_ + uVar17;
            if (iVar2 == 0) {
              iVar27 = auVar30._0_4_ + auVar45._0_4_ >> 1;
              iVar33 = auVar30._4_4_ + auVar45._4_4_ >> 1;
              iVar34 = auVar30._8_4_ + auVar45._8_4_ >> 1;
              iVar35 = auVar30._12_4_ + auVar45._12_4_ >> 1;
            }
            else {
              auVar45 = pmulld(auVar45,auVar21);
              auVar29 = pmulld(auVar30,auVar22);
              iVar27 = auVar29._0_4_ + auVar45._0_4_ >> 4;
              iVar33 = auVar29._4_4_ + auVar45._4_4_ >> 4;
              iVar34 = auVar29._8_4_ + auVar45._8_4_ >> 4;
              iVar35 = auVar29._12_4_ + auVar45._12_4_ >> 4;
            }
            in_XMM10 = pmovzxwd(auVar45,*(undefined8 *)(puVar10 + lVar15));
            auVar40._0_4_ = auVar25._8_2_ + uVar17;
            auVar40._4_4_ = auVar25._10_2_ + uVar17;
            auVar40._8_4_ = auVar25._12_2_ + uVar17;
            auVar40._12_4_ = auVar25._14_2_ + uVar17;
            if (iVar2 == 0) {
              iVar37 = auVar40._0_4_ + in_XMM10._0_4_ >> 1;
              iVar42 = auVar40._4_4_ + in_XMM10._4_4_ >> 1;
              iVar43 = auVar40._8_4_ + in_XMM10._8_4_ >> 1;
              iVar44 = auVar40._12_4_ + in_XMM10._12_4_ >> 1;
            }
            else {
              in_XMM10 = pmulld(in_XMM10,auVar21);
              auVar25 = pmulld(auVar40,auVar22);
              iVar37 = auVar25._0_4_ + in_XMM10._0_4_ >> 4;
              iVar42 = auVar25._4_4_ + in_XMM10._4_4_ >> 4;
              iVar43 = auVar25._8_4_ + in_XMM10._8_4_ >> 4;
              iVar44 = auVar25._12_4_ + in_XMM10._12_4_ >> 4;
            }
            auVar31._0_4_ = (int)(iVar27 + (iVar24 - uVar17)) >> auVar20;
            auVar31._4_4_ = (int)(iVar33 + (iVar24 - uVar17)) >> auVar20;
            auVar31._8_4_ = (int)(iVar34 + (iVar24 - uVar17)) >> auVar20;
            auVar31._12_4_ = (int)(iVar35 + (iVar24 - uVar17)) >> auVar20;
            auVar41._0_4_ = (int)(iVar37 + (iVar24 - uVar17)) >> auVar20;
            auVar41._4_4_ = (int)(iVar42 + (iVar24 - uVar17)) >> auVar20;
            auVar41._8_4_ = (int)(iVar43 + (iVar24 - uVar17)) >> auVar20;
            auVar41._12_4_ = (int)(iVar44 + (iVar24 - uVar17)) >> auVar20;
            auVar25 = packusdw(auVar31,auVar41);
            sVar26 = auVar25._0_2_;
            auVar39._0_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26;
            sVar26 = auVar25._2_2_;
            auVar39._2_2_ = (ushort)(sVar5 < sVar26) * sVar5 | (ushort)(sVar5 >= sVar26) * sVar26;
            sVar26 = auVar25._4_2_;
            auVar39._4_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26;
            sVar26 = auVar25._6_2_;
            auVar39._6_2_ = (ushort)(sVar5 < sVar26) * sVar5 | (ushort)(sVar5 >= sVar26) * sVar26;
            sVar26 = auVar25._8_2_;
            auVar39._8_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26;
            sVar26 = auVar25._10_2_;
            auVar39._10_2_ = (ushort)(sVar5 < sVar26) * sVar5 | (ushort)(sVar5 >= sVar26) * sVar26;
            sVar26 = auVar25._12_2_;
            sVar36 = auVar25._14_2_;
            auVar39._12_2_ = (ushort)(sVar4 < sVar26) * sVar4 | (ushort)(sVar4 >= sVar26) * sVar26;
            auVar39._14_2_ = (ushort)(sVar5 < sVar36) * sVar5 | (ushort)(sVar5 >= sVar36) * sVar36;
            puVar9 = dst0;
            iVar27 = dst_stride0;
          }
          *(long *)(puVar9 + uVar7 * (long)iVar27 + lVar15) = auVar39._0_8_;
          *(long *)(puVar9 + uVar7 * (long)iVar27 + lVar15 + iVar27) = auVar39._8_8_;
          lVar15 = lVar15 + 4;
        } while (lVar15 < w);
      }
      uVar7 = uVar7 + 2;
      puVar10 = puVar10 + lVar18 * 2;
      puVar16 = puVar16 + lVar18 * 2;
      puVar19 = puVar19 + lVar13 * 2;
      src = src + lVar13 * 2;
    } while (uVar7 < (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1(const uint16_t *src,
                                                 int src_stride, uint16_t *dst0,
                                                 int dst_stride0, int w, int h,
                                                 ConvolveParams *conv_params,
                                                 int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();
  int i, j;

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const __m128i offset_const_16b = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits <= 4);

  if (!(w % 8)) {
    for (i = 0; i < h; i += 1) {
      for (j = 0; j < w; j += 8) {
        const __m128i src_16bit =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j]));
        const __m128i res = _mm_sll_epi16(src_16bit, left_shift);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i res_32b_lo = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo =
              _mm_add_epi32(res_32b_lo, offset_const);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]),
                          res_unsigned_16b);
        }
      }
    }
  } else if (!(w % 4)) {
    for (i = 0; i < h; i += 2) {
      for (j = 0; j < w; j += 4) {
        const __m128i src_row_0 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j]));
        const __m128i src_row_1 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j + src_stride]));
        const __m128i src_10 = _mm_unpacklo_epi64(src_row_0, src_row_1);

        const __m128i res = _mm_sll_epi16(src_10, left_shift);

        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_1 = _mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

          const __m128i res_32b = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo = _mm_add_epi32(res_32b, offset_const);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_lo = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi = highbd_comp_avg_sse4_1(
              &data_ref_1, &res_unsigned_hi, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_1 = _mm_srli_si128(res_clip, 8);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          const __m128i res_1 = _mm_srli_si128(res_unsigned_16b, 8);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]),
                           res_unsigned_16b);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      }
    }
  }
}